

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::
GenerateDynamicMethodNewBuildMessageInfo(ImmutableMessageLiteGenerator *this,Printer *printer)

{
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *this_00;
  bool bVar1;
  Edition EVar2;
  int iVar3;
  uint32_t uVar4;
  JavaType JVar5;
  reference ppVar6;
  OneofGeneratorInfo *args_1;
  FieldDescriptor *pFVar7;
  ImmutableFieldLiteGenerator *pIVar8;
  Descriptor *pDVar9;
  ulong extraout_RDX;
  uint number;
  int iVar10;
  int i;
  int index;
  uint uVar11;
  uint32_t uVar12;
  size_t i_4;
  ulong uVar13;
  int i_1;
  long lVar14;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  iterator iVar15;
  vector<unsigned_short,_std::allocator<unsigned_short>_> chars;
  string line;
  unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  sorted_fields;
  FieldDescriptor *local_38;
  
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar9 = (this->super_MessageGenerator).descriptor_;
  uVar11 = (uint)(pDVar9->options_->field_0)._impl_.message_set_wire_format_ * 2;
  number = uVar11;
  if ((this->context_->options_).strip_nonfunctional_codegen == false) {
    EVar2 = FileDescriptor::edition(pDVar9->file_);
    if (EVar2 == EDITION_PROTO2) {
      number = uVar11 | 1;
    }
    else {
      EVar2 = FileDescriptor::edition(((this->super_MessageGenerator).descriptor_)->file_);
      number = uVar11 + 4;
      if ((int)EVar2 < 1000) {
        number = uVar11;
      }
    }
  }
  WriteUInt32ToUtf16CharSequence(number,&chars);
  WriteUInt32ToUtf16CharSequence(((this->super_MessageGenerator).descriptor_)->field_count_,&chars);
  if (((this->super_MessageGenerator).descriptor_)->field_count_ == 0) {
    text_03._M_str = "java.lang.Object[] objects = null;\n";
    text_03._M_len = 0x23;
    io::Printer::Print<>(printer,text_03);
  }
  else {
    text._M_str = "java.lang.Object[] objects = new java.lang.Object[] {\n";
    text._M_len = 0x36;
    io::Printer::Print<>(printer,text);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    WriteUInt32ToUtf16CharSequence
              ((uint32_t)
               (this->super_MessageGenerator).oneofs_.
               super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
               .
               super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
               .
               super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
               .tree_.size_,&chars);
    this_00 = &(this->super_MessageGenerator).oneofs_;
    iVar15 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
             ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                      *)this_00);
    line._M_dataplus._M_p = (pointer)iVar15.node_;
    line._M_string_length = CONCAT44(line._M_string_length._4_4_,iVar15.position_);
    iVar15 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
             ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                    *)this_00);
    sorted_fields._M_t.
    super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl =
         (__uniq_ptr_data<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>,_true,_true>
          )iVar15.node_;
    while (bVar1 = absl::lts_20250127::container_internal::
                   btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                   ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                                 *)&line,(iterator *)&sorted_fields), bVar1) {
      ppVar6 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
               ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                            *)&line);
      args_1 = Context::GetOneofGeneratorInfo(this->context_,ppVar6->second);
      text_00._M_str = "\"$oneof_name$_\",\n\"$oneof_name$Case_\",\n";
      text_00._M_len = 0x26;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,text_00,(char (*) [11])0x4e46f3,&args_1->name);
      absl::lts_20250127::container_internal::
      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
      ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                   *)&line);
    }
    iVar10 = 0;
    for (index = 0; pDVar9 = (this->super_MessageGenerator).descriptor_,
        index < pDVar9->field_count_; index = index + 1) {
      pFVar7 = Descriptor::field(pDVar9,index);
      pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (&this->field_generators_,pFVar7);
      iVar3 = (*(pIVar8->super_FieldGenerator)._vptr_FieldGenerator[3])(pIVar8);
      iVar10 = iVar10 + iVar3;
    }
    uVar4 = (iVar10 + 0x1f) / 0x20;
    uVar13 = (long)(iVar10 + 0x1f) % 0x20 & 0xffffffff;
    uVar11 = 0;
    uVar12 = uVar4;
    if ((int)uVar4 < 1) {
      uVar12 = 0;
    }
    for (; uVar12 != uVar11; uVar11 = uVar11 + 1) {
      GetBitFieldName_abi_cxx11_(&line,(java *)(ulong)uVar11,(int)uVar13);
      text_01._M_str = "\"$bit_field_name$\",\n";
      text_01._M_len = 0x14;
      io::Printer::Print<char[15],std::__cxx11::string>
                (printer,text_01,(char (*) [15])"bit_field_name",&line);
      std::__cxx11::string::~string((string *)&line);
      uVar13 = extraout_RDX;
    }
    WriteUInt32ToUtf16CharSequence(uVar4,&chars);
    sorted_fields._M_t.
    super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl =
         (__uniq_ptr_data<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>,_true,_true>
          )SortFieldsByNumber((this->super_MessageGenerator).descriptor_);
    uVar4 = 0;
    uVar12 = 0;
    for (lVar14 = 0; lVar14 < ((this->super_MessageGenerator).descriptor_)->field_count_;
        lVar14 = lVar14 + 1) {
      pFVar7 = *(FieldDescriptor **)
                ((long)sorted_fields._M_t.
                       super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                       .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
                       _M_head_impl + lVar14 * 8);
      bVar1 = FieldDescriptor::is_map(pFVar7);
      if (bVar1) {
        uVar4 = uVar4 + 1;
      }
      else {
        bVar1 = FieldDescriptor::is_repeated(pFVar7);
        uVar12 = uVar12 + bVar1;
      }
    }
    WriteUInt32ToUtf16CharSequence
              (*(uint32_t *)
                (*(long *)sorted_fields._M_t.
                          super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                          .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
                          _M_head_impl + 4),&chars);
    WriteUInt32ToUtf16CharSequence
              (*(uint32_t *)
                (*(long *)((long)sorted_fields._M_t.
                                 super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                 .
                                 super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>
                                 ._M_head_impl + -8 +
                          (long)((this->super_MessageGenerator).descriptor_)->field_count_ * 8) + 4)
               ,&chars);
    WriteUInt32ToUtf16CharSequence
              (((this->super_MessageGenerator).descriptor_)->field_count_,&chars);
    WriteUInt32ToUtf16CharSequence(uVar4,&chars);
    WriteUInt32ToUtf16CharSequence(uVar12,&chars);
    line.field_2._M_allocated_capacity = 0;
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length = 0;
    for (iVar10 = 0; pDVar9 = (this->super_MessageGenerator).descriptor_,
        iVar10 < pDVar9->field_count_; iVar10 = iVar10 + 1) {
      pFVar7 = Descriptor::field(pDVar9,iVar10);
      bVar1 = FieldDescriptor::is_required(pFVar7);
      if (bVar1) {
LAB_00237af9:
        local_38 = Descriptor::field((this->super_MessageGenerator).descriptor_,iVar10);
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::emplace_back<google::protobuf::FieldDescriptor_const*>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)&line,&local_38);
      }
      else {
        pFVar7 = Descriptor::field((this->super_MessageGenerator).descriptor_,iVar10);
        JVar5 = GetJavaType(pFVar7);
        if (JVar5 == JAVATYPE_MESSAGE) {
          pFVar7 = Descriptor::field((this->super_MessageGenerator).descriptor_,iVar10);
          pDVar9 = FieldDescriptor::message_type(pFVar7);
          bVar1 = HasRequiredFields(pDVar9);
          if (bVar1) goto LAB_00237af9;
        }
      }
    }
    WriteUInt32ToUtf16CharSequence
              ((uint32_t)(line._M_string_length - (long)line._M_dataplus._M_p >> 3),&chars);
    for (lVar14 = 0; lVar14 < ((this->super_MessageGenerator).descriptor_)->field_count_;
        lVar14 = lVar14 + 1) {
      pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (&this->field_generators_,
                          *(FieldDescriptor **)
                           ((long)sorted_fields._M_t.
                                  super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                  .
                                  super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>
                                  ._M_head_impl + lVar14 * 8));
      (*(pIVar8->super_FieldGenerator)._vptr_FieldGenerator[8])(pIVar8,printer,&chars);
    }
    io::Printer::Outdent(printer);
    text_02._M_str = "};\n";
    text_02._M_len = 3;
    io::Printer::Print<>(printer,text_02);
    std::
    _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~_Vector_base((_Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)&line);
    std::
    unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ::~unique_ptr(&sorted_fields);
  }
  text_04._M_str = "java.lang.String info =\n";
  text_04._M_len = 0x18;
  io::Printer::Print<>(printer,text_04);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_allocated_capacity = line.field_2._M_allocated_capacity & 0xffffffffffffff00;
  for (uVar13 = 0;
      uVar13 < (ulong)((long)chars.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)chars.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 1); uVar13 = uVar13 + 1) {
    EscapeUtf16ToString(chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar13],&line);
    if (0x4f < line._M_string_length) {
      text_05._M_str = "    \"$string$\" +\n";
      text_05._M_len = 0x11;
      io::Printer::Print<char[7],std::__cxx11::string>(printer,text_05,(char (*) [7])0x587889,&line)
      ;
      line._M_string_length = 0;
      *line._M_dataplus._M_p = '\0';
    }
  }
  text_06._M_str = "    \"$string$\";\n";
  text_06._M_len = 0x10;
  io::Printer::Print<char[7],std::__cxx11::string>(printer,text_06,(char (*) [7])0x587889,&line);
  text_07._M_str = "return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n";
  text_07._M_len = 0x38;
  io::Printer::Print<>(printer,text_07);
  io::Printer::Outdent(printer);
  std::__cxx11::string::~string((string *)&line);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateDynamicMethodNewBuildMessageInfo(
    io::Printer* printer) {
  printer->Indent();

  // Collect field info into a sequence of UTF-16 chars. It will be embedded
  // as a Java string in the generated code.
  std::vector<uint16_t> chars;

  int flags = 0;
  if (descriptor_->options().message_set_wire_format()) {
    flags |= 0x2;
  }
  if (!context_->options().strip_nonfunctional_codegen) {
    if (JavaGenerator::GetEdition(*descriptor_->file()) ==
        Edition::EDITION_PROTO2) {
      flags |= 0x1;
    } else if (JavaGenerator::GetEdition(*descriptor_->file()) >=
               Edition::EDITION_2023) {
      flags |= 0x4;
    }
  }

  WriteIntToUtf16CharSequence(flags, &chars);
  WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);

  if (descriptor_->field_count() == 0) {
    printer->Print("java.lang.Object[] objects = null;\n");
  } else {
    // A single array of all fields (including oneof, oneofCase, hasBits).
    printer->Print("java.lang.Object[] objects = new java.lang.Object[] {\n");
    printer->Indent();

    // Record the number of oneofs.
    WriteIntToUtf16CharSequence(oneofs_.size(), &chars);
    for (auto& kv : oneofs_) {
      printer->Print(
          "\"$oneof_name$_\",\n"
          "\"$oneof_name$Case_\",\n",
          "oneof_name", context_->GetOneofGeneratorInfo(kv.second)->name);
    }

    // Integers for bit fields.
    int total_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      total_bits +=
          field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
    }
    int total_ints = (total_bits + 31) / 32;
    for (int i = 0; i < total_ints; i++) {
      printer->Print("\"$bit_field_name$\",\n", "bit_field_name",
                     GetBitFieldName(i));
    }
    WriteIntToUtf16CharSequence(total_ints, &chars);

    int map_count = 0;
    int repeated_count = 0;
    std::unique_ptr<const FieldDescriptor*[]> sorted_fields(
        SortFieldsByNumber(descriptor_));
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      if (field->is_map()) {
        map_count++;
      } else if (field->is_repeated()) {
        repeated_count++;
      }
    }

    WriteIntToUtf16CharSequence(sorted_fields[0]->number(), &chars);
    WriteIntToUtf16CharSequence(
        sorted_fields[descriptor_->field_count() - 1]->number(), &chars);
    WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);
    WriteIntToUtf16CharSequence(map_count, &chars);
    WriteIntToUtf16CharSequence(repeated_count, &chars);

    std::vector<const FieldDescriptor*> fields_for_is_initialized_check;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (descriptor_->field(i)->is_required() ||
          (GetJavaType(descriptor_->field(i)) == JAVATYPE_MESSAGE &&
           HasRequiredFields(descriptor_->field(i)->message_type()))) {
        fields_for_is_initialized_check.push_back(descriptor_->field(i));
      }
    }
    WriteIntToUtf16CharSequence(fields_for_is_initialized_check.size(), &chars);

    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      field_generators_.get(field).GenerateFieldInfo(printer, &chars);
    }
    printer->Outdent();
    printer->Print("};\n");
  }

  printer->Print("java.lang.String info =\n");
  std::string line;
  for (size_t i = 0; i < chars.size(); i++) {
    uint16_t code = chars[i];
    EscapeUtf16ToString(code, &line);
    if (line.size() >= 80) {
      printer->Print("    \"$string$\" +\n", "string", line);
      line.clear();
    }
  }
  printer->Print("    \"$string$\";\n", "string", line);

  printer->Print("return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n");
  printer->Outdent();
}